

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_setup_connection(connectdata *conn)

{
  void *pvVar1;
  smb_request *req;
  connectdata *conn_local;
  
  pvVar1 = (*Curl_ccalloc)(1,0x18);
  (conn->data->req).protop = pvVar1;
  if (pvVar1 == (void *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    conn_local._4_4_ = smb_parse_url_path(conn);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smb_setup_connection(struct connectdata *conn)
{
  struct smb_request *req;

  /* Initialize the request state */
  conn->data->req.protop = req = calloc(1, sizeof(struct smb_request));
  if(!req)
    return CURLE_OUT_OF_MEMORY;

  /* Parse the URL path */
  return smb_parse_url_path(conn);
}